

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O3

Utest * __thiscall
TEST_ScoringTableTest_DealerWinByDiscard_TestShell::createTest
          (TEST_ScoringTableTest_DealerWinByDiscard_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                                  ,0xc);
  this_00->_vptr_Utest = (_func_int **)0x0;
  *(undefined1 *)&this_00[1]._vptr_Utest = 0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_001dd450;
  return this_00;
}

Assistant:

TEST(ScoringTableTest, DealerWinByDiscard)
{
	CHECK_EQUAL(1500, t.dealerWinByDiscard(1, 30));
	CHECK_EQUAL(2000, t.dealerWinByDiscard(1, 40));
	CHECK_EQUAL(2400, t.dealerWinByDiscard(1, 50));
	CHECK_EQUAL(2900, t.dealerWinByDiscard(1, 60));
	CHECK_EQUAL(3400, t.dealerWinByDiscard(1, 70));

	CHECK_EQUAL(2000, t.dealerWinByDiscard(2, 20));
	CHECK_EQUAL(2900, t.dealerWinByDiscard(2, 30));
	CHECK_EQUAL(3900, t.dealerWinByDiscard(2, 40));
	CHECK_EQUAL(4800, t.dealerWinByDiscard(2, 50));
	CHECK_EQUAL(5800, t.dealerWinByDiscard(2, 60));
	CHECK_EQUAL(6800, t.dealerWinByDiscard(2, 70));

	CHECK_EQUAL(3900, t.dealerWinByDiscard(3, 20));
	CHECK_EQUAL(5800, t.dealerWinByDiscard(3, 30));
	CHECK_EQUAL(7700, t.dealerWinByDiscard(3, 40));
	CHECK_EQUAL(9600, t.dealerWinByDiscard(3, 50));
	CHECK_EQUAL(11600, t.dealerWinByDiscard(3, 60));

	CHECK_EQUAL(7700, t.dealerWinByDiscard(4, 20));
	CHECK_EQUAL(11600, t.dealerWinByDiscard(4, 30));
}